

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void selectDisplayConnection(timeval *timeout)

{
  int iVar1;
  uint __i;
  int iVar2;
  long lVar3;
  int *piVar4;
  fd_set *__arr;
  fd_set fds;
  
  iVar1 = *(int *)(_glfw.x11.display + 0x10);
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    fds.__fds_bits[lVar3] = 0;
  }
  fds.__fds_bits[iVar1 / 0x40] = fds.__fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
  while( true ) {
    iVar2 = select(iVar1 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)timeout);
    if (iVar2 != -1) {
      return;
    }
    piVar4 = __errno_location();
    if (timeout != (timeval *)0x0) break;
    if (*piVar4 != 4) {
      return;
    }
  }
  return;
}

Assistant:

void selectDisplayConnection(struct timeval* timeout)
{
    fd_set fds;
    int result;
    const int fd = ConnectionNumber(_glfw.x11.display);

    FD_ZERO(&fds);
    FD_SET(fd, &fds);

    // NOTE: We use select instead of an X function like XNextEvent, as the
    //       wait inside those are guarded by the mutex protecting the display
    //       struct, locking out other threads from using X (including GLX)
    // NOTE: Only retry on EINTR if there is no timeout, as select is not
    //       required to update it for the time elapsed
    // TODO: Update timeout value manually
    do
    {
        result = select(fd + 1, &fds, NULL, NULL, timeout);
    }
    while (result == -1 && errno == EINTR && timeout == NULL);
}